

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_test.cc
# Opt level: O0

void leveldb::RunConcurrent(int run)

{
  int iVar1;
  Env *pEVar2;
  int local_100;
  int i_1;
  undefined1 local_f0 [8];
  TestState state;
  int i;
  int kSize;
  int N;
  Random rnd;
  int seed;
  int run_local;
  
  rnd.seed_ = run;
  iVar1 = test::RandomSeed();
  N = iVar1 + rnd.seed_ * 100;
  Random::Random((Random *)&kSize,N);
  state.state_cv_.mu_._4_4_ = 1000;
  for (state.state_cv_.mu_._0_4_ = 0; (int)(uint)state.state_cv_.mu_ < 1000;
      state.state_cv_.mu_._0_4_ = (uint)state.state_cv_.mu_ + 1) {
    if ((int)(uint)state.state_cv_.mu_ % 100 == 0) {
      fprintf(_stderr,"Run %d of %d\n",(ulong)(uint)state.state_cv_.mu_,1000);
    }
    TestState::TestState((TestState *)local_f0,N + 1);
    pEVar2 = Env::Default();
    (*pEVar2->_vptr_Env[0xf])(pEVar2,ConcurrentReader,local_f0);
    TestState::Wait((TestState *)local_f0,RUNNING);
    for (local_100 = 0; local_100 < 1000; local_100 = local_100 + 1) {
      ConcurrentTest::WriteStep((ConcurrentTest *)local_f0,(Random *)&kSize);
    }
    std::atomic<bool>::store((atomic<bool> *)&state.t_.list_.rnd_,true,memory_order_release);
    TestState::Wait((TestState *)local_f0,DONE);
    TestState::~TestState((TestState *)local_f0);
  }
  return;
}

Assistant:

static void RunConcurrent(int run) {
  const int seed = test::RandomSeed() + (run * 100);
  Random rnd(seed);
  const int N = 1000;
  const int kSize = 1000;
  for (int i = 0; i < N; i++) {
    if ((i % 100) == 0) {
      fprintf(stderr, "Run %d of %d\n", i, N);
    }
    TestState state(seed + 1);
    Env::Default()->Schedule(ConcurrentReader, &state);
    state.Wait(TestState::RUNNING);
    for (int i = 0; i < kSize; i++) {
      state.t_.WriteStep(&rnd);
    }
    state.quit_flag_.store(true, std::memory_order_release);
    state.Wait(TestState::DONE);
  }
}